

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int gmfsetkwdf77_(int64_t *MshIdx,int *KwdIdx,int *NmbLin,int *NmbTyp,int *TypTab,int *deg,
                 int *NmbNod)

{
  int iVar1;
  uint *in_RCX;
  int *in_RDX;
  uint *in_RSI;
  int64_t *in_RDI;
  undefined8 in_R8;
  uint *in_R9;
  undefined4 *in_stack_00000008;
  int local_4;
  
  iVar1 = strcmp(GmfKwdFmt[(int)*in_RSI][2],"hr");
  if (iVar1 == 0) {
    local_4 = GmfSetKwd(*in_RDI,(int)(ulong)*in_RSI,(long)*in_RDX,(ulong)*in_RCX,in_R8,(ulong)*in_R9
                        ,*in_stack_00000008);
  }
  else {
    iVar1 = strcmp(GmfKwdFmt[(int)*in_RSI][2],"sr");
    if (iVar1 == 0) {
      local_4 = GmfSetKwd(*in_RDI,(int)(ulong)*in_RSI,(long)*in_RDX,(ulong)*in_RCX,in_R8);
    }
    else {
      local_4 = GmfSetKwd(*in_RDI,(int)(ulong)*in_RSI,(long)*in_RDX);
    }
  }
  return local_4;
}

Assistant:

int APIF77(gmfsetkwdf77)(  int64_t *MshIdx, int *KwdIdx, int *NmbLin,
                           int *NmbTyp, int *TypTab, int *deg, int *NmbNod )
{
   if(!strcmp(GmfKwdFmt[ *KwdIdx ][2], "hr"))
      return(GmfSetKwd(*MshIdx, *KwdIdx, *NmbLin, *NmbTyp, TypTab, *deg, *NmbNod));
   else if(!strcmp(GmfKwdFmt[ *KwdIdx ][2], "sr"))
      return(GmfSetKwd(*MshIdx, *KwdIdx, *NmbLin, *NmbTyp, TypTab));
   else
      return(GmfSetKwd(*MshIdx, *KwdIdx, *NmbLin));
}